

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ReleaseTempRange(Parse *pParse,int iReg,int nReg)

{
  int in_EDX;
  int in_ESI;
  Parse *in_RDI;
  
  if (in_EDX == 1) {
    sqlite3ReleaseTempReg(in_RDI,in_ESI);
  }
  else if (in_RDI->nRangeReg < in_EDX) {
    in_RDI->nRangeReg = in_EDX;
    in_RDI->iRangeReg = in_ESI;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ReleaseTempRange(Parse *pParse, int iReg, int nReg){
  if( nReg==1 ){
    sqlite3ReleaseTempReg(pParse, iReg);
    return;
  }
  sqlite3VdbeReleaseRegisters(pParse, iReg, nReg, 0, 0);
  if( nReg>pParse->nRangeReg ){
    pParse->nRangeReg = nReg;
    pParse->iRangeReg = iReg;
  }
}